

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cxx
# Opt level: O3

bufptr __thiscall cornerstone::snapshot::serialize(snapshot *this)

{
  size_t sVar1;
  buffer *extraout_RDX;
  buffer *extraout_RDX_00;
  _Head_base<0UL,_cornerstone::buffer_*,_false> _Var2;
  ulong *in_RSI;
  bufptr bVar3;
  code *local_28;
  buffer *local_20;
  
  cluster_config::serialize((cluster_config *)&local_28);
  sVar1 = buffer::size(local_20);
  buffer::alloc((buffer *)this,sVar1 + 0x18);
  buffer::put((buffer *)this->last_log_term_,*in_RSI);
  buffer::put((buffer *)this->last_log_term_,in_RSI[1]);
  buffer::put((buffer *)this->last_log_term_,in_RSI[2]);
  buffer::put((buffer *)this->last_log_term_,local_20);
  buffer::pos((buffer *)this->last_log_term_,0);
  _Var2._M_head_impl = extraout_RDX;
  if (local_20 != (buffer *)0x0) {
    (*local_28)();
    _Var2._M_head_impl = extraout_RDX_00;
  }
  bVar3._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = _Var2._M_head_impl;
  bVar3._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)this;
  return (bufptr)bVar3._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr snapshot::serialize()
{
    bufptr conf_buf = last_config_->serialize();
    bufptr buf = buffer::alloc(conf_buf->size() + sz_ulong * 3);
    buf->put(last_log_idx_);
    buf->put(last_log_term_);
    buf->put(size_);
    buf->put(*conf_buf);
    buf->pos(0);
    return buf;
}